

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::Client::read_response_line(Client *this,Stream *strm,Response *res)

{
  _Alloc_hider __s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__nptr;
  bool bVar2;
  int iVar3;
  __ssize_t _Var4;
  size_t sVar5;
  pointer psVar6;
  int *piVar7;
  undefined8 uVar8;
  FILE *in_RCX;
  string *psVar9;
  long lVar10;
  cmatch m;
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  char *local_8b8;
  undefined8 local_8b0;
  char local_8a8;
  undefined7 uStack_8a7;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_898;
  stream_line_reader local_878;
  char *local_838;
  char local_830 [2048];
  
  paVar1 = &local_878.glowable_buffer_.field_2;
  local_878.fixed_buffer_ = local_830;
  local_878.fixed_buffer_size_ = 0x800;
  local_878.fixed_buffer_used_size_ = 0;
  local_878.glowable_buffer_._M_string_length = 0;
  local_878.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  local_878.strm_ = strm;
  local_878.glowable_buffer_._M_dataplus._M_p = (pointer)paVar1;
  _Var4 = detail::stream_line_reader::getline(&local_878,(char **)strm,(size_t *)res,in_RCX);
  if ((char)_Var4 != '\0') {
    if (read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Response&)::
                                   re_abi_cxx11_);
      if (iVar3 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                   "(HTTP/1\\.[01]) (\\d+?) .*\r\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_)
        ;
      }
    }
    local_898.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_898._M_begin = (char *)0x0;
    local_898.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_898.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar9 = &local_878.glowable_buffer_;
    if (local_878.glowable_buffer_._M_string_length == 0) {
      psVar9 = (string *)&local_878.fixed_buffer_;
    }
    __s._M_p = (psVar9->_M_dataplus)._M_p;
    sVar5 = strlen(__s._M_p);
    bVar2 = std::__detail::
            __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (__s._M_p,__s._M_p + sVar5,&local_898,
                       &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,0);
    if (bVar2) {
      lVar10 = (long)local_898.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_898.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar10 == 0) || (0xfffffffffffffffd < (lVar10 >> 3) * -0x5555555555555555 - 5U)) {
        psVar6 = (pointer)((long)local_898.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
      }
      else {
        psVar6 = local_898.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (psVar6->matched == true) {
        local_8b8 = &local_8a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8b8,(psVar6->super_pair<const_char_*,_const_char_*>).first,
                   (psVar6->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8b0 = 0;
        local_8a8 = '\0';
        local_8b8 = &local_8a8;
      }
      std::__cxx11::string::operator=((string *)res,(string *)&local_8b8);
      if (local_8b8 != &local_8a8) {
        operator_delete(local_8b8,CONCAT71(uStack_8a7,local_8a8) + 1);
      }
      lVar10 = (long)local_898.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_898.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
        psVar6 = (pointer)((long)local_898.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
      }
      else {
        psVar6 = local_898.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      if (psVar6->matched == true) {
        local_8b8 = &local_8a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8b8,(psVar6->super_pair<const_char_*,_const_char_*>).first,
                   (psVar6->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8b0 = 0;
        local_8a8 = '\0';
        local_8b8 = &local_8a8;
      }
      __nptr = local_8b8;
      piVar7 = __errno_location();
      iVar3 = *piVar7;
      *piVar7 = 0;
      lVar10 = strtol(__nptr,&local_838,10);
      if (local_838 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_001625ab:
        uVar8 = std::__throw_out_of_range("stoi");
        __cxa_guard_abort(&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_878.glowable_buffer_._M_dataplus._M_p != paVar1) {
          operator_delete(local_878.glowable_buffer_._M_dataplus._M_p,
                          CONCAT71(local_878.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                                   local_878.glowable_buffer_.field_2._M_local_buf[0]) + 1);
        }
        _Unwind_Resume(uVar8);
      }
      if (((int)lVar10 != lVar10) || (*piVar7 == 0x22)) goto LAB_001625ab;
      if (*piVar7 == 0) {
        *piVar7 = iVar3;
      }
      res->status = (int)lVar10;
      if (local_8b8 != &local_8a8) {
        operator_delete(local_8b8,CONCAT71(uStack_8a7,local_8a8) + 1);
      }
    }
    if (local_898.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_898.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_898.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_898.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878.glowable_buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_878.glowable_buffer_._M_dataplus._M_p,
                    CONCAT71(local_878.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                             local_878.glowable_buffer_.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(char)_Var4;
}

Assistant:

inline bool Client::read_response_line(Stream &strm, Response &res) {
  std::array<char, 2048> buf;

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  if (!line_reader.getline()) { return false; }

  const static std::regex re("(HTTP/1\\.[01]) (\\d+?) .*\r\n");

  std::cmatch m;
  if (std::regex_match(line_reader.ptr(), m, re)) {
    res.version = std::string(m[1]);
    res.status = std::stoi(std::string(m[2]));
  }

  return true;
}